

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

void Acb_ObjAddFanin(Acb_Ntk_t *p,int iObj,int iFanin)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = Acb_ObjFanins(p,iObj);
  if (iFanin < 1) {
    __assert_fail("iFanin > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0x1a3,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
  }
  iVar1 = *piVar2;
  if (piVar2[(long)iVar1 + 1] == -1) {
    *piVar2 = iVar1 + 1;
    piVar2[(long)iVar1 + 1] = iFanin;
    return;
  }
  __assert_fail("pFanins[ 1 + pFanins[0] ] == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x1a4,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
}

Assistant:

static inline void Acb_ObjAddFanin( Acb_Ntk_t * p, int iObj, int iFanin )
{
    int * pFanins = Acb_ObjFanins( p, iObj );
    assert( iFanin > 0 );
    assert( pFanins[ 1 + pFanins[0] ] == -1 );
    pFanins[ 1 + pFanins[0]++ ] = iFanin;
}